

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::PLA_IP(CPU *this)

{
  byte bVar1;
  int iVar2;
  
  this->cycles = 3;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(this->sp + 0x101));
  this->sp = this->sp + '\x01';
  bVar1 = (byte)iVar2;
  this->A = bVar1;
  this->cycles = this->cycles - 2;
  (this->field_6).ps = bVar1 & 0x80 | (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::PLA_IP()
{
    cycles = 4;
    A = GetStackByte();
    cycles--;
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}